

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O0

void __thiscall
stackless::
Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
::Frame(Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
        *this,env_p *environment)

{
  env_p *environment_local;
  Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
  *this_local;
  
  this->_vptr_Frame = (_func_int **)&PTR__Frame_00175b40;
  std::shared_ptr<implementations::scheme::environment>::shared_ptr(&this->env,environment);
  implementations::scheme::cell::cell(&this->result,Symbol);
  return;
}

Assistant:

Frame(env_p environment) : env(environment) {
		}